

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O2

void __thiscall
unodb::detail::dump_key<std::span<std::byte_const,18446744073709551615ul>>
          (detail *this,ostream *os,span<const_std::byte,_18446744073709551615UL> key)

{
  ostream *poVar1;
  size_type sz;
  size_t i;
  pointer pbVar2;
  
  poVar1 = std::operator<<((ostream *)this,"key(");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,"): 0x");
  for (pbVar2 = (pointer)0x0; key._M_ptr != pbVar2; pbVar2 = pbVar2 + 1) {
    dump_byte((ostream *)this,(byte)os[(long)pbVar2]);
  }
  return;
}

Assistant:

[[gnu::cold]] void dump_key(std::ostream &os, T key) {
  if constexpr (std::is_same_v<T, key_view>) {
    const auto sz = key.size_bytes();
    os << "key(" << sz << "): 0x";
    for (std::size_t i = 0; i < sz; ++i) unodb::detail::dump_byte(os, key[i]);
  } else {
    os << "key: 0x" << std::hex << std::setfill('0') << std::setw(sizeof(key))
       << key << std::dec;
  }
}